

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Grammar.hpp
# Opt level: O0

void __thiscall
Centaurus::Grammar<unsigned_char>::Grammar(Grammar<unsigned_char> *this,Grammar<unsigned_char> *old)

{
  Grammar<unsigned_char> *old_local;
  Grammar<unsigned_char> *this_local;
  
  IGrammar::IGrammar(&this->super_IGrammar);
  (this->super_IGrammar)._vptr_IGrammar = (_func_int **)&PTR__Grammar_00290558;
  std::
  unordered_map<Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>,_std::hash<Centaurus::Identifier>,_std::equal_to<Centaurus::Identifier>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>_>
  ::unordered_map(&this->m_networks,&old->m_networks);
  std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>::vector
            (&this->m_identifiers);
  Identifier::Identifier(&this->m_root_id,&old->m_root_id);
  Identifier::Identifier(&this->m_grammar_name);
  GrammarOptions::GrammarOptions(&this->m_options);
  return;
}

Assistant:

Grammar(Grammar&& old)
        : m_networks(std::move(old.m_networks)), m_root_id(old.m_root_id)
    {
    }